

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceArrayIntersectorK<4>_>,_false>
::occludedCoherent(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceArrayIntersectorK<4>_>,_false>
                   *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  undefined1 auVar2 [16];
  Collider CVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar12;
  undefined4 in_EAX;
  uint uVar13;
  int iVar14;
  long lVar15;
  Precalculations *pPVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  Precalculations *pPVar20;
  Precalculations *pPVar21;
  Precalculations *pPVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar26;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar27;
  uint uVar28;
  uint uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar63;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [12];
  float fVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [12];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar110;
  float fVar111;
  float fVar113;
  undefined1 auVar104 [16];
  float fVar112;
  float fVar114;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  vbool<4> vVar125;
  Precalculations pre;
  undefined1 local_1198 [16];
  undefined1 local_1168 [16];
  undefined4 local_1158;
  undefined4 uStack_1150;
  vbool<4> valid0;
  undefined1 local_1098 [16];
  undefined1 local_1078 [16];
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_f88;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar36 [16];
  undefined1 auVar107 [16];
  
  auVar32._0_4_ = -(uint)(*(int *)this == -1);
  auVar32._4_4_ = -(uint)(*(int *)(this + 4) == -1);
  auVar32._8_4_ = -(uint)(*(int *)(this + 8) == -1);
  auVar32._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
  uVar13 = movmskps(in_EAX,auVar32);
  if (uVar13 == 0) {
    return;
  }
  local_1068 = *(int *)this;
  iStack_1064 = *(int *)(this + 4);
  iStack_1060 = *(int *)(this + 8);
  iStack_105c = *(int *)(this + 0xc);
  lVar5 = (valid_i->field_0).v[0];
  local_1038._8_4_ = 0xffffffff;
  local_1038._0_8_ = 0xffffffffffffffff;
  local_1038._12_4_ = 0xffffffff;
  local_1038 = auVar32 ^ local_1038;
  auVar2._0_8_ = This->ptr;
  auVar2._8_8_ = This->leafIntersector;
  CVar3 = This->collider;
  auVar4._0_8_ = (This->intersector1).intersect;
  auVar4._8_8_ = (This->intersector1).occluded;
  auVar65._0_8_ = (This->intersector1).pointQuery;
  auVar65._8_8_ = (This->intersector1).name;
  fVar40 = *(float *)&(This->intersector4).intersect;
  fVar63 = *(float *)((long)&(This->intersector4).intersect + 4);
  fVar83 = *(float *)&(This->intersector4).occluded;
  fVar84 = *(float *)((long)&(This->intersector4).occluded + 4);
  fVar103 = (float)DAT_01f4bd50;
  fVar110 = DAT_01f4bd50._4_4_;
  fVar111 = DAT_01f4bd50._8_4_;
  fVar113 = DAT_01f4bd50._12_4_;
  auVar67._0_4_ = (uint)fVar40 & -(uint)(fVar103 <= ABS(fVar40));
  auVar67._4_4_ = (uint)fVar63 & -(uint)(fVar110 <= ABS(fVar63));
  auVar67._8_4_ = (uint)fVar83 & -(uint)(fVar111 <= ABS(fVar83));
  auVar67._12_4_ = (uint)fVar84 & -(uint)(fVar113 <= ABS(fVar84));
  auVar85._0_4_ = ~-(uint)(fVar103 <= ABS(fVar40)) & (uint)fVar103;
  auVar85._4_4_ = ~-(uint)(fVar110 <= ABS(fVar63)) & (uint)fVar110;
  auVar85._8_4_ = ~-(uint)(fVar111 <= ABS(fVar83)) & (uint)fVar111;
  auVar85._12_4_ = ~-(uint)(fVar113 <= ABS(fVar84)) & (uint)fVar113;
  auVar85 = auVar85 | auVar67;
  fVar119 = *(float *)&(This->intersector4).name;
  fVar1 = *(float *)((long)&(This->intersector4).name + 4);
  fVar117 = *(float *)&(This->intersector4_filter).intersect;
  fVar118 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
  auVar99._0_4_ = (uint)fVar119 & -(uint)(fVar103 <= ABS(fVar119));
  auVar99._4_4_ = (uint)fVar1 & -(uint)(fVar110 <= ABS(fVar1));
  auVar99._8_4_ = (uint)fVar117 & -(uint)(fVar111 <= ABS(fVar117));
  auVar99._12_4_ = (uint)fVar118 & -(uint)(fVar113 <= ABS(fVar118));
  auVar95._0_4_ = ~-(uint)(fVar103 <= ABS(fVar119)) & (uint)fVar103;
  auVar95._4_4_ = ~-(uint)(fVar110 <= ABS(fVar1)) & (uint)fVar110;
  auVar95._8_4_ = ~-(uint)(fVar111 <= ABS(fVar117)) & (uint)fVar111;
  auVar95._12_4_ = ~-(uint)(fVar113 <= ABS(fVar118)) & (uint)fVar113;
  auVar95 = auVar95 | auVar99;
  fVar120 = *(float *)&(This->intersector4_filter).occluded;
  fVar9 = *(float *)((long)&(This->intersector4_filter).occluded + 4);
  fVar10 = *(float *)&(This->intersector4_filter).name;
  fVar11 = *(float *)((long)&(This->intersector4_filter).name + 4);
  auVar75._0_4_ = ~-(uint)(fVar103 <= ABS(fVar120)) & (uint)fVar103;
  auVar75._4_4_ = ~-(uint)(fVar110 <= ABS(fVar9)) & (uint)fVar110;
  auVar75._8_4_ = ~-(uint)(fVar111 <= ABS(fVar10)) & (uint)fVar111;
  auVar75._12_4_ = ~-(uint)(fVar113 <= ABS(fVar11)) & (uint)fVar113;
  auVar104._4_4_ = (uint)fVar9 & -(uint)(fVar110 <= ABS(fVar9));
  auVar104._0_4_ = (uint)fVar120 & -(uint)(fVar103 <= ABS(fVar120));
  auVar104._8_4_ = (uint)fVar10 & -(uint)(fVar111 <= ABS(fVar10));
  auVar104._12_4_ = (uint)fVar11 & -(uint)(fVar113 <= ABS(fVar11));
  auVar75 = auVar75 | auVar104;
  auVar104 = rcpps(_DAT_01f4bd50,auVar85);
  fVar121 = auVar104._0_4_;
  auVar86._0_4_ = auVar85._0_4_ * fVar121;
  fVar122 = auVar104._4_4_;
  auVar86._4_4_ = auVar85._4_4_ * fVar122;
  fVar123 = auVar104._8_4_;
  auVar86._8_4_ = auVar85._8_4_ * fVar123;
  fVar124 = auVar104._12_4_;
  auVar86._12_4_ = auVar85._12_4_ * fVar124;
  fVar121 = (1.0 - auVar86._0_4_) * fVar121 + fVar121;
  fVar122 = (1.0 - auVar86._4_4_) * fVar122 + fVar122;
  fVar123 = (1.0 - auVar86._8_4_) * fVar123 + fVar123;
  fVar124 = (1.0 - auVar86._12_4_) * fVar124 + fVar124;
  auVar104 = rcpps(auVar86,auVar95);
  fVar103 = auVar104._0_4_;
  fVar111 = auVar104._4_4_;
  fVar112 = auVar104._8_4_;
  fVar114 = auVar104._12_4_;
  fVar103 = (1.0 - auVar95._0_4_ * fVar103) * fVar103 + fVar103;
  fVar111 = (1.0 - auVar95._4_4_ * fVar111) * fVar111 + fVar111;
  fVar112 = (1.0 - auVar95._8_4_ * fVar112) * fVar112 + fVar112;
  fVar114 = (1.0 - auVar95._12_4_ * fVar114) * fVar114 + fVar114;
  auVar104 = rcpps(auVar104,auVar75);
  fVar110 = auVar104._0_4_;
  fVar113 = auVar104._4_4_;
  fVar115 = auVar104._8_4_;
  fVar116 = auVar104._12_4_;
  fVar110 = (1.0 - auVar75._0_4_ * fVar110) * fVar110 + fVar110;
  fVar113 = (1.0 - auVar75._4_4_ * fVar113) * fVar113 + fVar113;
  fVar115 = (1.0 - auVar75._8_4_ * fVar115) * fVar115 + fVar115;
  fVar116 = (1.0 - auVar75._12_4_ * fVar116) * fVar116 + fVar116;
  auVar88._0_12_ = ZEXT812(0);
  auVar88._12_4_ = 0;
  auVar54._0_8_ = CONCAT44(-(uint)(fVar63 < 0.0),-(uint)(fVar40 < 0.0)) & 0x100000001;
  auVar54._8_4_ = -(uint)(fVar83 < 0.0) & 1;
  auVar54._12_4_ = -(uint)(fVar84 < 0.0) & 1;
  local_1048 = maxps(auVar65,auVar88);
  auVar69._0_8_ = CONCAT44(-(uint)(fVar1 < 0.0),-(uint)(fVar119 < 0.0)) & 0x200000002;
  auVar69._8_4_ = -(uint)(fVar117 < 0.0) & 2;
  auVar69._12_4_ = -(uint)(fVar118 < 0.0) & 2;
  auVar78._0_8_ = CONCAT44(-(uint)(fVar9 < 0.0),-(uint)(fVar120 < 0.0)) & 0x400000004;
  auVar78._8_4_ = -(uint)(fVar10 < 0.0) & 4;
  auVar78._12_4_ = -(uint)(fVar11 < 0.0) & 4;
  local_1058 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar88);
  auVar43._8_4_ = 0xffffffff;
  auVar43._0_8_ = 0xffffffffffffffff;
  auVar43._12_4_ = 0xffffffff;
  local_1078 = auVar32 ^ auVar43 | auVar54 | auVar78 | auVar69;
  pPVar16 = (Precalculations *)(ulong)(uVar13 & 0xff);
LAB_0066a793:
  lVar15 = 0;
  if (pPVar16 != (Precalculations *)0x0) {
    for (; ((ulong)pPVar16 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  iVar14 = *(int *)(local_1078 + lVar15 * 4);
  local_1098._0_4_ = -(uint)(iVar14 == local_1078._0_4_);
  local_1098._4_4_ = -(uint)(iVar14 == local_1078._4_4_);
  local_1098._8_4_ = -(uint)(iVar14 == local_1078._8_4_);
  local_1098._12_4_ = -(uint)(iVar14 == local_1078._12_4_);
  uVar19 = movmskps((int)valid_i,local_1098);
  stack[0].mask = CONCAT44((int)((ulong)valid_i >> 0x20),uVar19);
  stack[0].ptr.ptr = *(size_t *)(lVar5 + 0x70);
  auVar54 = ~local_1098 & _DAT_01f45a30;
  auVar32 = local_1048 & local_1098 | auVar54;
  local_1198._0_8_ = CONCAT44(~local_1098._4_4_,~local_1098._0_4_) & 0xff800000ff800000;
  local_1198._8_4_ = ~local_1098._8_4_ & 0xff800000;
  local_1198._12_4_ = ~local_1098._12_4_ & 0xff800000;
  local_1168._0_4_ = local_1058._0_4_ & local_1098._0_4_ | ~local_1098._0_4_ & 0xff800000;
  local_1168._4_4_ = local_1058._4_4_ & local_1098._4_4_ | ~local_1098._4_4_ & 0xff800000;
  local_1168._8_4_ = local_1058._8_4_ & local_1098._8_4_ | ~local_1098._8_4_ & 0xff800000;
  local_1168._12_4_ = local_1058._12_4_ & local_1098._12_4_ | ~local_1098._12_4_ & 0xff800000;
  auVar65 = auVar2 & local_1098 | auVar54;
  auVar76._4_4_ = auVar65._0_4_;
  auVar76._0_4_ = auVar65._4_4_;
  auVar76._8_4_ = auVar65._12_4_;
  auVar76._12_4_ = auVar65._8_4_;
  auVar65 = minps(auVar76,auVar65);
  auVar66._0_8_ = auVar65._8_8_;
  auVar66._8_4_ = auVar65._0_4_;
  auVar66._12_4_ = auVar65._4_4_;
  auVar67 = minps(auVar66,auVar65);
  auVar65 = (undefined1  [16])CVar3 & local_1098 | auVar54;
  auVar96._4_4_ = auVar65._0_4_;
  auVar96._0_4_ = auVar65._4_4_;
  auVar96._8_4_ = auVar65._12_4_;
  auVar96._12_4_ = auVar65._8_4_;
  auVar65 = minps(auVar96,auVar65);
  auVar33._0_8_ = auVar65._8_8_;
  auVar33._8_4_ = auVar65._0_4_;
  auVar33._12_4_ = auVar65._4_4_;
  auVar65 = minps(auVar33,auVar65);
  auVar104 = auVar4 & local_1098 | auVar54;
  auVar97._4_4_ = auVar104._0_4_;
  auVar97._0_4_ = auVar104._4_4_;
  auVar97._8_4_ = auVar104._12_4_;
  auVar97._12_4_ = auVar104._8_4_;
  auVar104 = minps(auVar97,auVar104);
  auVar87._0_8_ = auVar104._8_8_;
  auVar87._8_4_ = auVar104._0_4_;
  auVar87._12_4_ = auVar104._4_4_;
  auVar88 = minps(auVar87,auVar104);
  auVar104 = auVar2 & local_1098 | local_1198;
  auVar89._4_4_ = auVar104._0_4_;
  auVar89._0_4_ = auVar104._4_4_;
  auVar89._8_4_ = auVar104._12_4_;
  auVar89._12_4_ = auVar104._8_4_;
  auVar104 = maxps(auVar89,auVar104);
  auVar42._0_8_ = auVar104._8_8_;
  auVar42._8_4_ = auVar104._0_4_;
  auVar42._12_4_ = auVar104._4_4_;
  auVar43 = maxps(auVar42,auVar104);
  auVar104 = (undefined1  [16])CVar3 & local_1098 | local_1198;
  auVar90._4_4_ = auVar104._0_4_;
  auVar90._0_4_ = auVar104._4_4_;
  auVar90._8_4_ = auVar104._12_4_;
  auVar90._12_4_ = auVar104._8_4_;
  auVar104 = maxps(auVar90,auVar104);
  auVar77._0_8_ = auVar104._8_8_;
  auVar77._8_4_ = auVar104._0_4_;
  auVar77._12_4_ = auVar104._4_4_;
  auVar78 = maxps(auVar77,auVar104);
  auVar104 = auVar4 & local_1098 | local_1198;
  auVar44._4_4_ = auVar104._0_4_;
  auVar44._0_4_ = auVar104._4_4_;
  auVar44._8_4_ = auVar104._12_4_;
  auVar44._12_4_ = auVar104._8_4_;
  auVar104 = maxps(auVar44,auVar104);
  auVar68._0_8_ = auVar104._8_8_;
  auVar68._8_4_ = auVar104._0_4_;
  auVar68._12_4_ = auVar104._4_4_;
  auVar69 = maxps(auVar68,auVar104);
  auVar70._0_8_ = CONCAT44((uint)fVar122 & local_1098._4_4_,(uint)fVar121 & local_1098._0_4_);
  auVar70._8_4_ = (uint)fVar123 & local_1098._8_4_;
  auVar70._12_4_ = (uint)fVar124 & local_1098._12_4_;
  auVar79._8_4_ = auVar70._8_4_;
  auVar79._0_8_ = auVar70._0_8_;
  auVar79._12_4_ = auVar70._12_4_;
  auVar79 = auVar79 | auVar54;
  auVar98._4_4_ = auVar79._0_4_;
  auVar98._0_4_ = auVar79._4_4_;
  auVar98._8_4_ = auVar79._12_4_;
  auVar98._12_4_ = auVar79._8_4_;
  auVar99 = minps(auVar98,auVar79);
  auVar80._0_8_ = CONCAT44((uint)fVar111 & local_1098._4_4_,(uint)fVar103 & local_1098._0_4_);
  auVar80._8_4_ = (uint)fVar112 & local_1098._8_4_;
  auVar80._12_4_ = (uint)fVar114 & local_1098._12_4_;
  auVar91._8_4_ = auVar80._8_4_;
  auVar91._0_8_ = auVar80._0_8_;
  auVar91._12_4_ = auVar80._12_4_;
  auVar91 = auVar91 | auVar54;
  auVar45._4_4_ = auVar91._0_4_;
  auVar45._0_4_ = auVar91._4_4_;
  auVar45._8_4_ = auVar91._12_4_;
  auVar45._12_4_ = auVar91._8_4_;
  auVar104 = minps(auVar45,auVar91);
  auVar92._0_4_ = (uint)fVar110 & local_1098._0_4_;
  auVar92._4_4_ = (uint)fVar113 & local_1098._4_4_;
  auVar92._8_4_ = (uint)fVar115 & local_1098._8_4_;
  auVar92._12_4_ = (uint)fVar116 & local_1098._12_4_;
  auVar54 = auVar54 | auVar92;
  auVar105._4_4_ = auVar54._0_4_;
  auVar105._0_4_ = auVar54._4_4_;
  auVar105._8_4_ = auVar54._12_4_;
  auVar105._12_4_ = auVar54._8_4_;
  auVar54 = minps(auVar105,auVar54);
  auVar55._0_8_ = auVar54._8_8_;
  auVar55._8_4_ = auVar54._0_4_;
  auVar55._12_4_ = auVar54._4_4_;
  auVar54 = minps(auVar55,auVar54);
  auVar107._0_8_ = auVar99._0_8_;
  auVar107._8_4_ = auVar99._4_4_;
  auVar107._12_4_ = auVar104._4_4_;
  auVar106._8_8_ = auVar107._8_8_;
  auVar106._0_4_ = auVar99._0_4_;
  auVar106._4_4_ = auVar104._0_4_;
  auVar100._4_4_ = auVar104._8_4_;
  auVar100._0_4_ = auVar99._8_4_;
  auVar100._8_4_ = auVar99._12_4_;
  auVar100._12_4_ = auVar104._12_4_;
  auVar104 = minps(auVar100,auVar106);
  fVar40 = auVar54._0_4_;
  fVar63 = auVar104._0_4_;
  fVar83 = auVar104._4_4_;
  auVar70 = auVar70 | local_1198;
  auVar56._4_4_ = auVar70._0_4_;
  auVar56._0_4_ = auVar70._4_4_;
  auVar56._8_4_ = auVar70._12_4_;
  auVar56._12_4_ = auVar70._8_4_;
  auVar54 = maxps(auVar56,auVar70);
  auVar80 = auVar80 | local_1198;
  auVar71._4_4_ = auVar80._0_4_;
  auVar71._0_4_ = auVar80._4_4_;
  auVar71._8_4_ = auVar80._12_4_;
  auVar71._12_4_ = auVar80._8_4_;
  auVar99 = maxps(auVar71,auVar80);
  auVar92 = auVar92 | local_1198;
  auVar34._4_4_ = auVar92._0_4_;
  auVar34._0_4_ = auVar92._4_4_;
  auVar34._8_4_ = auVar92._12_4_;
  auVar34._12_4_ = auVar92._8_4_;
  auVar104 = maxps(auVar34,auVar92);
  auVar81._0_8_ = auVar104._8_8_;
  auVar81._8_4_ = auVar104._0_4_;
  auVar81._12_4_ = auVar104._4_4_;
  auVar75 = maxps(auVar81,auVar104);
  auVar36._0_8_ = auVar54._0_8_;
  auVar36._8_4_ = auVar54._4_4_;
  auVar36._12_4_ = auVar99._4_4_;
  auVar35._8_8_ = auVar36._8_8_;
  auVar35._0_4_ = auVar54._0_4_;
  auVar35._4_4_ = auVar99._0_4_;
  auVar57._4_4_ = auVar99._8_4_;
  auVar57._0_4_ = auVar54._8_4_;
  auVar57._8_4_ = auVar54._12_4_;
  auVar57._12_4_ = auVar99._12_4_;
  auVar54 = maxps(auVar57,auVar35);
  auVar46._4_4_ = auVar32._0_4_;
  auVar46._0_4_ = auVar32._4_4_;
  auVar46._8_4_ = auVar32._12_4_;
  auVar46._12_4_ = auVar32._8_4_;
  auVar104 = minps(auVar46,auVar32);
  auVar72._4_4_ = local_1168._0_4_;
  auVar72._0_4_ = local_1168._4_4_;
  auVar72._8_4_ = local_1168._12_4_;
  auVar72._12_4_ = local_1168._8_4_;
  auVar99 = maxps(auVar72,local_1168);
  uVar13 = -(uint)(fVar63 < 0.0);
  uVar28 = -(uint)(fVar83 < 0.0);
  uVar29 = -(uint)(fVar40 < 0.0);
  auVar30._0_4_ = ~uVar13 & (uint)fVar63;
  auVar30._4_4_ = ~uVar28 & (uint)fVar83;
  auVar30._8_4_ = ~uVar29 & (uint)fVar40;
  auVar64._0_4_ = auVar54._0_4_ & uVar13;
  auVar64._4_4_ = auVar54._4_4_ & uVar28;
  auVar64._8_4_ = auVar75._0_4_ & uVar29;
  auVar64 = auVar64 | auVar30;
  auVar41._0_4_ = ~uVar13 & auVar67._0_4_;
  auVar41._4_4_ = ~uVar28 & auVar65._0_4_;
  auVar41._8_4_ = ~uVar29 & auVar88._0_4_;
  auVar31._4_4_ = auVar78._0_4_ & uVar28;
  auVar31._0_4_ = auVar43._0_4_ & uVar13;
  local_fa8 = auVar64._0_4_;
  local_f98 = auVar64._4_4_;
  local_fd8 = auVar64._8_4_;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  uVar18 = (ulong)(local_f98 < 0.0) << 4 | 0x20;
  auVar31._8_4_ = auVar69._0_4_ & uVar29;
  auVar31 = auVar31 | auVar41;
  uVar25 = (ulong)(local_fd8 < 0.0) << 4 | 0x40;
  pPVar20 = (Precalculations *)(~stack[0].mask & (ulong)pPVar16);
  auVar94._0_4_ = (uint)fVar63 & uVar13;
  auVar94._4_4_ = (uint)fVar83 & uVar28;
  auVar94._8_4_ = (uint)fVar40 & uVar29;
  auVar74._0_4_ = ~uVar13 & auVar54._0_4_;
  auVar74._4_4_ = ~uVar28 & auVar54._4_4_;
  auVar74._8_4_ = ~uVar29 & auVar75._0_4_;
  auVar74 = auVar74 | auVar94;
  local_fb8 = (float)(auVar67._0_4_ & uVar13 | ~uVar13 & auVar43._0_4_) * local_fa8;
  local_fc8 = (float)(auVar65._0_4_ & uVar28 | ~uVar28 & auVar78._0_4_) * local_f98;
  fVar63 = (float)(auVar88._0_4_ & uVar29 | ~uVar29 & auVar69._0_4_) * local_fd8;
  local_fe8 = auVar74._0_4_;
  local_ff8 = auVar31._0_4_ * local_fe8;
  fVar83 = auVar74._4_4_;
  local_1008 = auVar31._4_4_ * fVar83;
  fVar84 = auVar74._8_4_;
  fVar40 = auVar31._8_4_ * fVar84;
  uVar24 = (ulong)(local_fa8 < 0.0) * 0x10;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_1198._0_4_ = auVar104._0_4_;
  local_1198._8_4_ = auVar104._8_4_;
  auVar47._4_4_ = local_1198._0_4_;
  auVar47._0_4_ = local_1198._0_4_;
  auVar47._8_4_ = local_1198._0_4_;
  auVar47._12_4_ = local_1198._0_4_;
  auVar58._4_4_ = local_1198._8_4_;
  auVar58._0_4_ = local_1198._8_4_;
  auVar58._8_4_ = local_1198._8_4_;
  auVar58._12_4_ = local_1198._8_4_;
  auVar65 = minps(auVar58,auVar47);
  local_1158 = auVar99._0_4_;
  uStack_1150 = auVar99._8_4_;
  auVar48._4_4_ = local_1158;
  auVar48._0_4_ = local_1158;
  auVar48._8_4_ = local_1158;
  auVar48._12_4_ = local_1158;
  auVar59._4_4_ = uStack_1150;
  auVar59._0_4_ = uStack_1150;
  auVar59._8_4_ = uStack_1150;
  auVar59._12_4_ = uStack_1150;
  auVar104 = maxps(auVar59,auVar48);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_1018._4_4_ = fVar83;
  local_1018._0_4_ = fVar83;
  fStack_1010 = fVar83;
  fStack_100c = fVar83;
  local_1028._4_4_ = fVar84;
  local_1028._0_4_ = fVar84;
  fStack_1020 = fVar84;
  fStack_101c = fVar84;
  pSVar27 = stack + 1;
  valid_i = (vint<4> *)pPVar20;
LAB_0066ab44:
  uVar19 = movmskps((int)pPVar16,local_1038);
  pSVar26 = pSVar27;
  do {
    if (pSVar26 == stack) goto LAB_0066aea6;
    pSVar27 = pSVar26 + -1;
    pSVar12 = pSVar26 + -1;
    pSVar26 = pSVar27;
    if ((pSVar12->mask & ~CONCAT44((int)((ulong)pPVar16 >> 0x20),uVar19)) != 0) {
      sVar23 = 1;
      pPVar22 = (Precalculations *)(pSVar27->ptr).ptr;
      do {
        pSVar26 = pSVar27;
        if (((ulong)pPVar22 & 8) != 0) {
          if (sVar23 != 0) {
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            valid0.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(local_1038 ^ auVar6);
            lVar15 = (ulong)((uint)pPVar22 & 0xf) - 7;
            goto LAB_0066ad5c;
          }
          break;
        }
        pPVar21 = pPVar22 + uVar24 + 0x20;
        auVar37._0_4_ = *(float *)pPVar21 * local_fa8 - local_fb8;
        auVar37._4_4_ = *(float *)(pPVar21 + 4) * fStack_fa4 - fStack_fb4;
        auVar37._8_4_ = *(float *)(pPVar21 + 8) * fStack_fa0 - fStack_fb0;
        auVar37._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_f9c - fStack_fac;
        pPVar21 = pPVar22 + uVar18 + 0x20;
        auVar49._0_4_ = *(float *)pPVar21 * local_f98 - local_fc8;
        auVar49._4_4_ = *(float *)(pPVar21 + 4) * fStack_f94 - fStack_fc4;
        auVar49._8_4_ = *(float *)(pPVar21 + 8) * fStack_f90 - fStack_fc0;
        auVar49._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_f8c - fStack_fbc;
        auVar43 = maxps(auVar37,auVar49);
        pPVar21 = pPVar22 + uVar25 + 0x20;
        auVar50._0_4_ = *(float *)pPVar21 * local_fd8 - fVar63;
        auVar50._4_4_ = *(float *)(pPVar21 + 4) * fStack_fd4 - fVar63;
        auVar50._8_4_ = *(float *)(pPVar21 + 8) * fStack_fd0 - fVar63;
        auVar50._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_fcc - fVar63;
        auVar54 = maxps(auVar50,auVar65);
        auVar43 = maxps(auVar43,auVar54);
        pPVar21 = pPVar22 + (uVar24 ^ 0x10) + 0x20;
        auVar51._0_4_ = *(float *)pPVar21 * local_fe8 - local_ff8;
        auVar51._4_4_ = *(float *)(pPVar21 + 4) * fStack_fe4 - fStack_ff4;
        auVar51._8_4_ = *(float *)(pPVar21 + 8) * fStack_fe0 - fStack_ff0;
        auVar51._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_fdc - fStack_fec;
        pPVar21 = pPVar22 + (uVar18 ^ 0x10) + 0x20;
        auVar60._0_4_ = *(float *)pPVar21 * (float)local_1018._0_4_ - local_1008;
        auVar60._4_4_ = *(float *)(pPVar21 + 4) * (float)local_1018._4_4_ - fStack_1004;
        auVar60._8_4_ = *(float *)(pPVar21 + 8) * fStack_1010 - fStack_1000;
        auVar60._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_100c - fStack_ffc;
        auVar54 = minps(auVar51,auVar60);
        pPVar21 = pPVar22 + (uVar25 ^ 0x10) + 0x20;
        auVar61._0_4_ = *(float *)pPVar21 * (float)local_1028._0_4_ - fVar40;
        auVar61._4_4_ = *(float *)(pPVar21 + 4) * (float)local_1028._4_4_ - fVar40;
        auVar61._8_4_ = *(float *)(pPVar21 + 8) * fStack_1020 - fVar40;
        auVar61._12_4_ = *(float *)(pPVar21 + 0xc) * fStack_101c - fVar40;
        auVar67 = minps(auVar61,auVar104);
        auVar54 = minps(auVar54,auVar67);
        auVar38._4_4_ = -(uint)(auVar43._4_4_ <= auVar54._4_4_);
        auVar38._0_4_ = -(uint)(auVar43._0_4_ <= auVar54._0_4_);
        auVar38._8_4_ = -(uint)(auVar43._8_4_ <= auVar54._8_4_);
        auVar38._12_4_ = -(uint)(auVar43._12_4_ <= auVar54._12_4_);
        uVar13 = movmskps((int)uVar18,auVar38);
        if (uVar13 == 0) break;
        uVar17 = (ulong)(uVar13 & 0xff);
        sVar23 = 0;
        pPVar21 = (Precalculations *)0x8;
        do {
          lVar15 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          fVar83 = *(float *)(pPVar22 + lVar15 * 4 + 0x20);
          fVar84 = *(float *)(pPVar22 + lVar15 * 4 + 0x30);
          fVar119 = *(float *)(pPVar22 + lVar15 * 4 + 0x40);
          fVar1 = *(float *)(pPVar22 + lVar15 * 4 + 0x50);
          fVar117 = (float)((ulong)auVar2._0_8_ >> 0x20);
          fVar118 = (float)((ulong)auVar2._8_8_ >> 0x20);
          auVar39._0_8_ =
               CONCAT44((fVar83 - fVar117) * fVar122,(fVar83 - (float)auVar2._0_8_) * fVar121);
          auVar39._8_4_ = (fVar83 - (float)auVar2._8_8_) * fVar123;
          auVar39._12_4_ = (fVar83 - fVar118) * fVar124;
          auVar52._0_8_ =
               CONCAT44((fVar119 - CVar3.collide._4_4_) * fVar111,
                        (fVar119 - CVar3.collide._0_4_) * fVar103);
          auVar52._8_4_ = (fVar119 - CVar3.name._0_4_) * fVar112;
          auVar52._12_4_ = (fVar119 - CVar3.name._4_4_) * fVar114;
          fVar83 = *(float *)(pPVar22 + lVar15 * 4 + 0x60);
          fVar119 = (float)((ulong)auVar4._0_8_ >> 0x20);
          fVar120 = (float)((ulong)auVar4._8_8_ >> 0x20);
          auVar82._0_8_ =
               CONCAT44((fVar83 - fVar119) * fVar113,(fVar83 - (float)auVar4._0_8_) * fVar110);
          auVar82._8_4_ = (fVar83 - (float)auVar4._8_8_) * fVar115;
          auVar82._12_4_ = (fVar83 - fVar120) * fVar116;
          auVar62._0_4_ = (fVar84 - (float)auVar2._0_8_) * fVar121;
          auVar62._4_4_ = (fVar84 - fVar117) * fVar122;
          auVar62._8_4_ = (fVar84 - (float)auVar2._8_8_) * fVar123;
          auVar62._12_4_ = (fVar84 - fVar118) * fVar124;
          auVar73._0_4_ = (fVar1 - CVar3.collide._0_4_) * fVar103;
          auVar73._4_4_ = (fVar1 - CVar3.collide._4_4_) * fVar111;
          auVar73._8_4_ = (fVar1 - CVar3.name._0_4_) * fVar112;
          auVar73._12_4_ = (fVar1 - CVar3.name._4_4_) * fVar114;
          fVar83 = *(float *)(pPVar22 + lVar15 * 4 + 0x70);
          auVar93._0_4_ = (fVar83 - (float)auVar4._0_8_) * fVar110;
          auVar93._4_4_ = (fVar83 - fVar119) * fVar113;
          auVar93._8_4_ = (fVar83 - (float)auVar4._8_8_) * fVar115;
          auVar93._12_4_ = (fVar83 - fVar120) * fVar116;
          auVar101._8_4_ = auVar39._8_4_;
          auVar101._0_8_ = auVar39._0_8_;
          auVar101._12_4_ = auVar39._12_4_;
          auVar43 = minps(auVar101,auVar62);
          auVar108._8_4_ = auVar52._8_4_;
          auVar108._0_8_ = auVar52._0_8_;
          auVar108._12_4_ = auVar52._12_4_;
          auVar54 = minps(auVar108,auVar73);
          auVar43 = maxps(auVar43,auVar54);
          auVar109._8_4_ = auVar82._8_4_;
          auVar109._0_8_ = auVar82._0_8_;
          auVar109._12_4_ = auVar82._12_4_;
          auVar54 = minps(auVar109,auVar93);
          auVar67 = maxps(auVar43,auVar54);
          auVar43 = maxps(auVar39,auVar62);
          auVar54 = maxps(auVar52,auVar73);
          auVar43 = minps(auVar43,auVar54);
          auVar54 = maxps(auVar82,auVar93);
          auVar43 = minps(auVar43,auVar54);
          auVar54 = maxps(auVar67,auVar32);
          auVar43 = minps(auVar43,local_1168);
          auVar102._4_4_ = -(uint)(auVar54._4_4_ <= auVar43._4_4_);
          auVar102._0_4_ = -(uint)(auVar54._0_4_ <= auVar43._0_4_);
          auVar102._8_4_ = -(uint)(auVar54._8_4_ <= auVar43._8_4_);
          auVar102._12_4_ = -(uint)(auVar54._12_4_ <= auVar43._12_4_);
          uVar13 = movmskps((int)context,auVar102);
          context = (RayQueryContext *)(ulong)uVar13;
          valid_i = (vint<4> *)pPVar21;
          if (uVar13 != 0) {
            valid_i = *(vint<4> **)(pPVar22 + lVar15 * 8);
            if (pPVar21 != (Precalculations *)0x8) {
              (pSVar27->ptr).ptr = (size_t)pPVar21;
              pSVar27->mask = sVar23;
              pSVar27 = pSVar27 + 1;
            }
            sVar23 = (size_t)(byte)uVar13;
          }
          uVar17 = uVar17 & uVar17 - 1;
          pPVar21 = (Precalculations *)valid_i;
        } while (uVar17 != 0);
        pPVar22 = (Precalculations *)valid_i;
        pSVar26 = pSVar27;
      } while ((Precalculations *)valid_i != (Precalculations *)0x8);
    }
  } while( true );
  while( true ) {
    valid_i = (vint<4> *)&valid0;
    context = (RayQueryContext *)ray;
    vVar125 = InstanceArrayIntersectorK<4>::occluded
                        ((vbool<4> *)&local_f88,(Precalculations *)valid_i,(RayK<4> *)&pre,
                         (RayQueryContext *)This,(Primitive *)ray);
    valid0.field_0.i[0] = ~local_f88.i[0] & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~local_f88.i[1] & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~local_f88.i[2] & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~local_f88.i[3] & valid0.field_0.i[3];
    iVar14 = movmskps(vVar125.field_0._0_4_,(undefined1  [16])valid0.field_0);
    if (iVar14 == 0) break;
LAB_0066ad5c:
    lVar15 = lVar15 + -1;
    if (lVar15 == 0) break;
  }
  auVar7._8_4_ = 0xffffffff;
  auVar7._0_8_ = 0xffffffffffffffff;
  auVar7._12_4_ = 0xffffffff;
  local_1038 = local_1038 | (undefined1  [16])valid0.field_0 ^ auVar7;
  local_1098 = ~local_1038 & local_1098;
  iVar14 = movmskps((int)lVar15,local_1098);
  pPVar16 = (Precalculations *)CONCAT44((int)((ulong)lVar15 >> 0x20),iVar14);
  if (iVar14 == 0) goto LAB_0066aea6;
  auVar8._8_4_ = 0xffffffff;
  auVar8._0_8_ = 0xffffffffffffffff;
  auVar8._12_4_ = 0xffffffff;
  local_1168 = (local_1038 ^ auVar8) & local_1168 | local_1038 & _DAT_01f45a40;
  goto LAB_0066ab44;
LAB_0066aea6:
  pPVar16 = pPVar20;
  if (pPVar20 == (Precalculations *)0x0) {
    auVar53._0_4_ = -(uint)(local_1068 == -1);
    auVar53._4_4_ = -(uint)(iStack_1064 == -1);
    auVar53._8_4_ = -(uint)(iStack_1060 == -1);
    auVar53._12_4_ = -(uint)(iStack_105c == -1);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name =
         ~(auVar53 & local_1038) & *(undefined1 (*) [16])&(This->intersector4_nofilter).name |
         _DAT_01f45a40 & auVar53 & local_1038;
    return;
  }
  goto LAB_0066a793;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }